

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double ON_MaximumCoordinate(double *data,int dim,bool is_rat,int count,int stride)

{
  double dVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  double a;
  double dVar6;
  double dVar7;
  
  if ((int)CONCAT71(in_register_00000011,is_rat) == 0) {
    if (0 < count) {
      dVar5 = 0.0;
      uVar4 = 0;
      do {
        if (0 < dim) {
          uVar2 = 0;
          do {
            dVar5 = ON_Max(dVar5,ABS(data[uVar2]));
            uVar2 = uVar2 + 1;
          } while ((uint)dim != uVar2);
        }
        uVar4 = uVar4 + 1;
        data = data + stride;
      } while (uVar4 != (uint)count);
      return dVar5;
    }
  }
  else if (0 < count) {
    uVar4 = 0;
    dVar5 = 0.0;
    pdVar3 = data;
    do {
      dVar1 = data[(long)dim + uVar4 * (long)stride];
      a = 0.0;
      if (0 < dim) {
        uVar2 = 0;
        do {
          a = ON_Max(a,ABS(pdVar3[uVar2]));
          uVar2 = uVar2 + 1;
        } while ((uint)dim != uVar2);
      }
      dVar7 = ABS(dVar1);
      dVar6 = dVar5;
      if (dVar1 != 0.0) {
        dVar6 = a / dVar7;
      }
      uVar2 = -(ulong)(dVar7 * dVar5 < a);
      dVar5 = (double)(~uVar2 & (ulong)dVar5 | (ulong)dVar6 & uVar2);
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + stride;
    } while (uVar4 != (uint)count);
    return dVar5;
  }
  return 0.0;
}

Assistant:

double ON_MaximumCoordinate(const double* data, int dim, bool is_rat, int count, int stride)
{
  double norm = 0;
  if (is_rat)
  {
    for (int i = 0; i < count; i++)
    {
      double w = fabs(data[i*stride + dim ]);
      double norm_i = 0;
      for (int j = 0; j < dim; j++)
        norm_i = ON_Max(norm_i, fabs(data[i*stride + j]));
      if (norm_i > norm * w && w>0)
        norm = norm_i / w;
    }
  }
  else
  {
    for (int i = 0; i < count; i++)
      for (int j=0; j<dim; j++)
        norm = ON_Max(norm, fabs(data[i*stride + j]));
  }
  return norm;
}